

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_env.hpp
# Opt level: O2

Environment * iutest::TestEnv::AddGlobalTestEnvironment(Environment *env)

{
  Variable *pVVar1;
  Environment *in_RDI;
  Environment *local_10;
  
  if (in_RDI == (Environment *)0x0) {
    local_10 = (Environment *)0x0;
  }
  else {
    local_10 = in_RDI;
    pVVar1 = get_vars();
    std::vector<iutest::Environment_*,_std::allocator<iutest::Environment_*>_>::push_back
              (&pVVar1->m_environment_list,&local_10);
  }
  return local_10;
}

Assistant:

static Environment* AddGlobalTestEnvironment(Environment* env)
    {
        if( env == NULL )
        {
            return NULL;
        }
        environments().push_back(env);
        return env;
    }